

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

bool __thiscall cmCTestMultiProcessHandler::StartTest(cmCTestMultiProcessHandler *this,int test)

{
  mapped_type *ppcVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  key_type local_34;
  
  ppcVar1 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_34);
  p_Var3 = ((*ppcVar1)->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &((*ppcVar1)->LockedResources)._M_t._M_impl.super__Rb_tree_header;
  bVar7 = (_Rb_tree_header *)p_Var3 == p_Var6;
  if (!bVar7) {
    do {
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->LockedResources)._M_t,(key_type *)(p_Var3 + 1));
      if ((_Rb_tree_header *)cVar2._M_node !=
          &(this->LockedResources)._M_t._M_impl.super__Rb_tree_header) {
        if (!bVar7) goto LAB_00208a8b;
        break;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar7 = (_Rb_tree_header *)p_Var3 == p_Var6;
    } while (!bVar7);
  }
  pmVar4 = std::
           map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>_>_>_>
           ::operator[](&this->ResourceAllocationErrors,&local_34);
  if ((((pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) &&
      (bVar7 = AllocateResources(this,test), !bVar7)) ||
     (pmVar5 = std::
               map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
               ::operator[](&(this->Tests).
                             super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                            ,&local_34),
     (pmVar5->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
     super__Rb_tree_header._M_node_count != 0)) {
    DeallocateResources(this,test);
LAB_00208a8b:
    bVar7 = false;
  }
  else {
    bVar7 = StartTestProcess(this,test);
  }
  return bVar7;
}

Assistant:

bool cmCTestMultiProcessHandler::StartTest(int test)
{
  // Check for locked resources
  for (std::string const& i : this->Properties[test]->LockedResources) {
    if (cm::contains(this->LockedResources, i)) {
      return false;
    }
  }

  // Allocate resources
  if (this->ResourceAllocationErrors[test].empty() &&
      !this->AllocateResources(test)) {
    this->DeallocateResources(test);
    return false;
  }

  // if there are no depends left then run this test
  if (this->Tests[test].empty()) {
    return this->StartTestProcess(test);
  }
  // This test was not able to start because it is waiting
  // on depends to run
  this->DeallocateResources(test);
  return false;
}